

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::push_back
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this,
          SAttribute *element)

{
  uint uVar1;
  undefined1 local_38 [8];
  SAttribute e;
  SAttribute *element_local;
  array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this_local;
  
  e.Value._8_8_ = element;
  if (this->allocated < this->used + 1) {
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::SAttribute((SAttribute *)local_38)
    ;
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::operator=
              ((SAttribute *)local_38,(SAttribute *)e.Value._8_8_);
    reallocate(this,this->used * 2 + 1);
    uVar1 = this->used;
    this->used = uVar1 + 1;
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + uVar1,(SAttribute *)local_38);
    this->is_sorted = false;
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::~SAttribute
              ((SAttribute *)local_38);
  }
  else {
    uVar1 = this->used;
    this->used = uVar1 + 1;
    irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute::operator=
              (this->data + uVar1,element);
    this->is_sorted = false;
  }
  return;
}

Assistant:

void push_back(const T& element)
	{
		if (used + 1 > allocated)
		{
			// reallocate(used * 2 +1);
			// this doesn't work if the element is in the same array. So
			// we'll copy the element first to be sure we'll get no data
			// corruption

			T e;
			e = element;           // copy element
			reallocate(used * 2 +1); // increase data block
			data[used++] = e;        // push_back
			is_sorted = false; 
			return;
		}

		data[used++] = element;
		is_sorted = false;
	}